

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_common.cc
# Opt level: O0

size_t woff2::CollectionHeaderSize(uint32_t header_version,uint32_t num_fonts)

{
  undefined8 local_18;
  size_t size;
  uint32_t num_fonts_local;
  uint32_t header_version_local;
  
  local_18 = 0;
  if (header_version == 0x20000) {
    local_18 = 0xc;
  }
  if ((header_version == 0x10000) || (header_version == 0x20000)) {
    local_18 = (num_fonts * 4 + 0xc) + local_18;
  }
  return local_18;
}

Assistant:

size_t CollectionHeaderSize(uint32_t header_version, uint32_t num_fonts) {
  size_t size = 0;
  if (header_version == 0x00020000) {
    size += 12;  // ulDsig{Tag,Length,Offset}
  }
  if (header_version == 0x00010000 || header_version == 0x00020000) {
    size += 12   // TTCTag, Version, numFonts
      + 4 * num_fonts;  // OffsetTable[numFonts]
  }
  return size;
}